

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::MidiMessage(MidiMessage *this,int command,int p1)

{
  allocator_type local_19;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2,&local_19);
  *(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data
   ._M_start = (uchar)command;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = (uchar)p1;
  return;
}

Assistant:

MidiMessage::MidiMessage(int command, int p1) : vector<uchar>(2) {
	(*this)[0] = (uchar)command;
	(*this)[1] = (uchar)p1;
}